

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O2

Vec_Int_t * Gia_ShowMapAdds(Gia_Man_t *p,Vec_Int_t *vAdds,int fFadds,Vec_Int_t *vBold)

{
  int iVar1;
  int iVar2;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  int Entry;
  int iVar3;
  
  p_00 = Vec_BitStart(p->nObjs);
  p_01 = Vec_IntStartFull(p->nObjs);
  if (vBold != (Vec_Int_t *)0x0) {
    for (iVar3 = 0; iVar3 < vBold->nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(vBold,iVar3);
      Vec_BitWriteEntry(p_00,iVar1,Entry);
    }
  }
  iVar1 = 0;
  iVar3 = 2;
  do {
    if (vAdds->nSize <= iVar3 + -2) {
      Vec_BitFree(p_00);
      return p_01;
    }
    if (fFadds == 0) {
LAB_0062c122:
      iVar2 = Vec_IntEntry(vAdds,iVar3 + 1);
      iVar2 = Vec_BitEntry(p_00,iVar2);
      if (iVar2 == 0) {
        iVar2 = Vec_IntEntry(vAdds,iVar3 + 2);
        iVar2 = Vec_BitEntry(p_00,iVar2);
        if (iVar2 == 0) {
          iVar2 = Vec_IntEntry(vAdds,iVar3 + 1);
          Vec_IntWriteEntry(p_01,iVar2,iVar1);
          iVar2 = Vec_IntEntry(vAdds,iVar3 + 2);
          Vec_IntWriteEntry(p_01,iVar2,iVar1);
        }
      }
    }
    else {
      iVar2 = Vec_IntEntry(vAdds,iVar3);
      if (iVar2 != 0) goto LAB_0062c122;
    }
    iVar1 = iVar1 + 1;
    iVar3 = iVar3 + 6;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ShowMapAdds( Gia_Man_t * p, Vec_Int_t * vAdds, int fFadds, Vec_Int_t * vBold )
{
    Vec_Bit_t * vIsBold = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMapAdds = Vec_IntStartFull( Gia_ManObjNum(p) ); int i, Entry;
    if ( vBold )
        Vec_IntForEachEntry( vBold, Entry, i )
            Vec_BitWriteEntry( vIsBold, Entry, 1 );
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( fFadds && Vec_IntEntry(vAdds, 6*i+2) == 0 )
            continue;
        if ( Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+4)) )
            continue;
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+3), i );
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+4), i );
    }
    Vec_BitFree( vIsBold );
    return vMapAdds;
}